

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigTransform.cpp
# Opt level: O1

void __thiscall
xmrig::ConfigTransform::transformBoolean(ConfigTransform *this,Document *doc,int key,bool enable)

{
  char *key_00;
  
  if (key == 0x3f1) {
    key_00 = "huge-pages";
  }
  else {
    if (key != 0x400) {
      return;
    }
    key_00 = "enabled";
  }
  BaseTransform::set<bool>(&this->super_BaseTransform,doc,"cpu",key_00,enable);
  return;
}

Assistant:

void xmrig::ConfigTransform::transformBoolean(rapidjson::Document &doc, int key, bool enable)
{
    switch (key) {
    case IConfig::HugePagesKey: /* --no-huge-pages */
        return set(doc, kCpu, "huge-pages", enable);

    case IConfig::CPUKey:       /* --no-cpu */
        return set(doc, kCpu, kEnabled, enable);

    default:
        break;
    }
}